

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.c
# Opt level: O0

_Bool art_node48_internal_validate(art_t *art,art_node48_t *node,art_internal_validate_t validator)

{
  byte bVar1;
  art_internal_validate_t validator_00;
  _Bool _Var2;
  int iVar3;
  art_t *art_00;
  long in_RSI;
  undefined8 in_RDI;
  undefined8 unaff_retaddr;
  int in_stack_00000020;
  int i_1;
  uint8_t other_child_idx;
  uint64_t other_children;
  uint8_t child_idx_1;
  uint64_t expected_used_children;
  art_ref_t child;
  uint8_t child_idx;
  int i;
  uint64_t used_children;
  int local_50;
  art_t *local_48;
  undefined7 in_stack_ffffffffffffffc0;
  byte in_stack_ffffffffffffffc7;
  int local_24;
  art_t *input_num;
  undefined8 uVar4;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (*(byte *)(in_RSI + 6) < 0x11) {
    _Var2 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                              "Node48 has too few children");
  }
  else if (*(byte *)(in_RSI + 6) < 0x31) {
    input_num = (art_t *)0x0;
    for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
      bVar1 = *(byte *)(in_RSI + 0x10 + (long)local_24);
      if (bVar1 != 0x30) {
        if (((ulong)input_num & 1L << (bVar1 & 0x3f)) != 0) {
          _Var2 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                    "Node48 keys point to the same child index");
          return _Var2;
        }
        if (*(long *)(in_RSI + 0x110 + (ulong)bVar1 * 8) == 0) {
          _Var2 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                    "Node48 has a NULL child");
          return _Var2;
        }
        input_num = (art_t *)(1L << (bVar1 & 0x3f) | (ulong)input_num);
      }
    }
    art_00 = (art_t *)(*(ulong *)(in_RSI + 8) ^ 0xffffffffffff);
    if (input_num == art_00) {
      while (input_num != (art_t *)0x0) {
        iVar3 = roaring_trailing_zeroes((unsigned_long_long)input_num);
        in_stack_ffffffffffffffc7 = (byte)iVar3;
        local_48 = (art_t *)((ulong)((long)input_num[-1].nodes + 0x2fU) & (ulong)input_num);
        input_num = local_48;
        for (; local_48 != (art_t *)0x0;
            local_48 = (art_t *)((ulong)((long)local_48[-1].nodes + 0x2fU) & (ulong)local_48)) {
          iVar3 = roaring_trailing_zeroes((unsigned_long_long)local_48);
          if (*(long *)(in_RSI + 0x110 + (ulong)in_stack_ffffffffffffffc7 * 8) ==
              *(long *)(in_RSI + 0x110 + (ulong)(byte)iVar3 * 8)) {
            _Var2 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                      "Node48 has duplicate children");
            return _Var2;
          }
        }
      }
      in_stack_00000020 = in_stack_00000020 + 1;
      uVar4 = 0;
      for (local_50 = 0; local_50 < 0x100; local_50 = local_50 + 1) {
        if (*(char *)(in_RSI + 0x10 + (long)local_50) != '0') {
          (&stack0x00000024)[in_stack_00000020 + -1] = (char)local_50;
          validator_00.validate_cb = (art_validate_cb_t)in_RSI;
          validator_00.reason = (char **)uVar4;
          validator_00.context = (void *)in_RDI;
          validator_00.depth = (int)in_stack_fffffffffffffff8;
          validator_00.current_key[0] = (char)((uint7)in_stack_fffffffffffffff8 >> 0x20);
          validator_00.current_key[1] = (char)((uint7)in_stack_fffffffffffffff8 >> 0x28);
          validator_00.current_key[2] = (char)((uint7)in_stack_fffffffffffffff8 >> 0x30);
          validator_00.current_key[3] = in_stack_ffffffffffffffff;
          validator_00._32_8_ = unaff_retaddr;
          _Var2 = art_internal_validate_at
                            (art_00,CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                             validator_00);
          if (!_Var2) {
            return false;
          }
        }
      }
      _Var2 = true;
    }
    else {
      _Var2 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                                "Node48 available_children does not match actual children");
    }
  }
  else {
    _Var2 = art_validate_fail((art_internal_validate_t *)&stack0x00000008,
                              "Node48 has too many children");
  }
  return _Var2;
}

Assistant:

static bool art_node48_internal_validate(const art_t *art,
                                         const art_node48_t *node,
                                         art_internal_validate_t validator) {
    if (node->count <= 16) {
        return art_validate_fail(&validator, "Node48 has too few children");
    }
    if (node->count > 48) {
        return art_validate_fail(&validator, "Node48 has too many children");
    }
    uint64_t used_children = 0;
    for (int i = 0; i < 256; ++i) {
        uint8_t child_idx = node->keys[i];
        if (child_idx != CROARING_ART_NODE48_EMPTY_VAL) {
            if (used_children & (UINT64_C(1) << child_idx)) {
                return art_validate_fail(
                    &validator, "Node48 keys point to the same child index");
            }

            art_ref_t child = node->children[child_idx];
            if (child == CROARING_ART_NULL_REF) {
                return art_validate_fail(&validator, "Node48 has a NULL child");
            }
            used_children |= UINT64_C(1) << child_idx;
        }
    }
    uint64_t expected_used_children =
        (node->available_children) ^ CROARING_NODE48_AVAILABLE_CHILDREN_MASK;
    if (used_children != expected_used_children) {
        return art_validate_fail(
            &validator,
            "Node48 available_children does not match actual children");
    }
    while (used_children != 0) {
        uint8_t child_idx = roaring_trailing_zeroes(used_children);
        used_children &= used_children - 1;

        uint64_t other_children = used_children;
        while (other_children != 0) {
            uint8_t other_child_idx = roaring_trailing_zeroes(other_children);
            if (node->children[child_idx] == node->children[other_child_idx]) {
                return art_validate_fail(&validator,
                                         "Node48 has duplicate children");
            }
            other_children &= other_children - 1;
        }
    }

    validator.depth++;
    for (int i = 0; i < 256; ++i) {
        if (node->keys[i] != CROARING_ART_NODE48_EMPTY_VAL) {
            validator.current_key[validator.depth - 1] = i;
            if (!art_internal_validate_at(art, node->children[node->keys[i]],
                                          validator)) {
                return false;
            }
        }
    }
    return true;
}